

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMap.cpp
# Opt level: O3

Var Js::JavascriptMap::EntryHas(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Var aValue;
  JavascriptMap *this;
  RecyclableObject *key;
  JavascriptBoolean *pJVar5;
  int in_stack_00000010;
  undefined1 local_38 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptMap.cpp"
                                ,0xd9,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_38 = (undefined1  [8])callInfo;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)local_38,(CallInfo *)&args.super_Arguments.Values);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  aValue = Arguments::operator[]((Arguments *)local_38,0);
  bVar3 = VarIs<Js::JavascriptMap>(aValue);
  if (bVar3) {
    this = UnsafeVarTo<Js::JavascriptMap>(aValue);
    if (this != (JavascriptMap *)0x0) {
      if (((ulong)local_38 & 0xfffffe) == 0) {
        key = (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
              undefinedValue.ptr;
      }
      else {
        key = (RecyclableObject *)Arguments::operator[]((Arguments *)local_38,1);
      }
      bVar3 = Has(this,key);
      pJVar5 = JavascriptLibrary::CreateBoolean
                         ((pSVar1->super_ScriptContextBase).javascriptLibrary,(uint)bVar3);
      return pJVar5;
    }
  }
  JavascriptError::ThrowTypeErrorVar(pSVar1,-0x7ff5ec04,L"Map.prototype.has",L"Map");
}

Assistant:

Var JavascriptMap::EntryHas(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    JavascriptMap* map = JavascriptOperators::TryFromVar<JavascriptMap>(args[0]);
    if (map == nullptr)
    {
        JavascriptError::ThrowTypeErrorVar(scriptContext, JSERR_NeedObjectOfType, _u("Map.prototype.has"), _u("Map"));
    }

    Var key = (args.Info.Count > 1) ? args[1] : scriptContext->GetLibrary()->GetUndefined();

    bool hasValue = map->Has(key);

    return scriptContext->GetLibrary()->CreateBoolean(hasValue);
}